

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckLength(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Dict *pDVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  Bool BVar5;
  uint code;
  char *pcVar6;
  
  if ((attval != (AttVal *)0x0) && (pcVar6 = attval->value, pcVar6 != (char *)0x0)) {
    if (((((attval->dict == (Attribute *)0x0) || (node == (Node *)0x0)) ||
         (attval->dict->id != TidyAttr_WIDTH)) || (pDVar1 = node->tag, pDVar1 == (Dict *)0x0)) ||
       ((pDVar1->id != TidyTag_COL && ((pDVar1 == (Dict *)0x0 || (pDVar1->id != TidyTag_COLGROUP))))
       )) {
      BVar5 = prvTidyIsDigit((int)*pcVar6);
      if (BVar5 == no) {
LAB_0013e26a:
        code = 0x22b;
        goto LAB_0013e278;
      }
      cVar4 = pcVar6[1];
      if (cVar4 != '\0') {
        pcVar6 = pcVar6 + 2;
        bVar2 = false;
        do {
          if ((bVar2) || (bVar3 = true, cVar4 != '%')) {
            if (bVar2) goto LAB_0013e26a;
            BVar5 = prvTidyIsDigit((int)cVar4);
            bVar3 = false;
            if (BVar5 == no) goto LAB_0013e26a;
          }
          bVar2 = bVar3;
          cVar4 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar4 != '\0');
      }
    }
    return;
  }
  code = 0x256;
LAB_0013e278:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckLength( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check for <col width=...> and <colgroup width=...> */
    if (attrIsWIDTH(attval) && (nodeIsCOL(node) || nodeIsCOLGROUP(node)))
        return;

    p = attval->value;
    
    if (!TY_(IsDigit)(*p++))
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else
    {
        Bool percentFound = no;
        while (*p)
        {
            if (!percentFound && *p == '%')
            {
                percentFound = yes;
            }
            else if (percentFound || !TY_(IsDigit)(*p))
            {
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
            }

            ++p;
        }
    }
}